

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# consolelog.hpp
# Opt level: O0

void __thiscall
github111116::ConsoleLogger::info<char[16],char_const*>
          (ConsoleLogger *this,char (*args) [16],char **args_1)

{
  char (*in_RDX) [16];
  ConsoleLogger *in_RSI;
  mutex *in_RDI;
  
  if (*(int *)((long)&in_RDI[2].super___mutex_base._M_mutex + 0x1c) < 2) {
    std::mutex::lock(in_RDI);
    if ((in_RDI[2].super___mutex_base._M_mutex.__size[0x18] & 1U) != 0) {
      std::operator<<((ostream *)(in_RDI->super___mutex_base)._M_mutex.__align,
                      (string *)((in_RDI->super___mutex_base)._M_mutex.__size + 8));
    }
    std::operator<<((ostream *)(in_RDI->super___mutex_base)._M_mutex.__align,"[i] ");
    if ((in_RDI[2].super___mutex_base._M_mutex.__size[0x18] & 1U) != 0) {
      std::operator<<((ostream *)(in_RDI->super___mutex_base)._M_mutex.__align,"\x1b[0m");
    }
    print<char[16],char_const*>(in_RSI,in_RDX,(char **)in_RDI);
    std::mutex::unlock((mutex *)0x16a01d);
  }
  return;
}

Assistant:

void ConsoleLogger::info(const Args&... args)
{
	if (loglevel > 1) return;
	mtx.lock();
	if (colored) out << infoColor;
	out << "[i] ";
	if (colored) out << "\033[0m";
	print(args...);
	mtx.unlock();
}